

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O2

int __thiscall csv::icu::FileDataSource::open(FileDataSource *this,char *__file,int __oflag,...)

{
  UFILE *pUVar1;
  FILE *__stream;
  long lVar2;
  int iVar3;
  char *pcVar4;
  string file_codepage;
  detected_language detected;
  
  close(this,(int)__file);
  pcVar4 = "";
  if (___oflag != (char *)0x0) {
    pcVar4 = ___oflag;
  }
  std::__cxx11::string::string((string *)&file_codepage,pcVar4,(allocator *)&detected);
  if (file_codepage._M_string_length == 0) {
    encoding::TextEncodingForFile(&detected,__file);
    if (detected.name._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&file_codepage);
      encoding::detected_language::~detected_language(&detected);
      goto LAB_001154a6;
    }
    encoding::detected_language::~detected_language(&detected);
  }
  else {
LAB_001154a6:
    pUVar1 = (UFILE *)u_fopen_70(__file,"rb",0,file_codepage._M_dataplus._M_p);
    this->_in = pUVar1;
    if (pUVar1 != (UFILE *)0x0) {
      __stream = (FILE *)u_fgetfile_70(pUVar1);
      fseek(__stream,0,2);
      lVar2 = ftell(__stream);
      this->_length = lVar2;
      fseek(__stream,0,0);
      iVar3 = (int)CONCAT71((int7)((ulong)this >> 8),this->_in != (UFILE *)0x0);
      goto LAB_0011550b;
    }
  }
  iVar3 = 0;
LAB_0011550b:
  std::__cxx11::string::~string((string *)&file_codepage);
  return iVar3;
}

Assistant:

bool FileDataSource::open(const char* file, const char* codepage) {

		// Close if we have one open already
		close();

		std::string file_codepage = codepage ?: "";
		if (file_codepage.length() == 0) {
			const auto detected = encoding::TextEncodingForFile(file);
			if (detected.invalid()) {
				return false;
			}
			file_codepage = detected.name;
		}

		_in = u_fopen(file, "rb", NULL, file_codepage.c_str());
		if (_in != NULL) {
			FILE* internal_file = u_fgetfile(_in);
			fseek(internal_file, 0L, SEEK_END);
			_length = ftell(internal_file);
			fseek(internal_file, 0L, SEEK_SET);
		}

		return _in != NULL;
	}